

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O3

void tchecker::refdbm::asynchronous_open_up(db_t *rdbm,reference_clock_variables_t *r)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2bf,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar3 = is_consistent(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c0,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar3 = is_tight(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c1,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  uVar2 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (uVar2 == *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    uVar1 = r->_refcount;
    if ((ulong)uVar1 != 0) {
      uVar4 = 0;
      do {
        uVar5 = uVar2 & 0xffffffff;
        uVar6 = uVar4;
        if ((int)uVar2 != 0) {
          do {
            rdbm[uVar6 & 0xffffffff] = (db_t)0x7ffffffe;
            uVar6 = uVar6 + uVar2;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        rdbm[(uint)(((int)uVar2 + 1) * (int)uVar4)] = (db_t)0x1;
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
    bVar3 = is_consistent(rdbm,r);
    if (bVar3) {
      bVar3 = is_tight(rdbm,r);
      if (bVar3) {
        return;
      }
      __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                    ,0x2cf,
                    "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                   );
    }
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2ce,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

void asynchronous_open_up(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  // x - r < inf for all clock x and reference clock r (including x being a
  // reference clock)
  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const refcount = r.refcount();

  for (tchecker::clock_id_t t = 0; t < refcount; ++t) {
    for (tchecker::clock_id_t x = 0; x < rdim; ++x)
      RDBM(x, t) = tchecker::dbm::LT_INFINITY;
    RDBM(t, t) = tchecker::dbm::LE_ZERO;
  }

  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
}